

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O3

void print_typeinfo(MOJOSHADER_symbolTypeInfo *info,uint indent)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = indent;
  if (indent == 0) {
    printf("      symbol class %s\n",print_typeinfo::symclasses[info->parameter_class]);
  }
  else {
    do {
      printf("    ");
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    printf("      symbol class %s\n",print_typeinfo::symclasses[info->parameter_class]);
    uVar2 = indent;
    do {
      printf("    ");
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  printf("      symbol type %s\n",
         print_typeinfo_symtypes_rel +
         *(int *)(print_typeinfo_symtypes_rel + (ulong)info->parameter_type * 4));
  uVar2 = indent;
  if (indent == 0) {
    printf("      rows %u\n",(ulong)info->rows);
    printf("      columns %u\n",(ulong)info->columns);
  }
  else {
    do {
      printf("    ");
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    printf("      rows %u\n",(ulong)info->rows);
    uVar2 = indent;
    do {
      printf("    ");
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
    printf("      columns %u\n",(ulong)info->columns);
    uVar2 = indent;
    do {
      printf("    ");
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  printf("      elements %u\n",(ulong)info->elements);
  if (info->member_count != 0) {
    uVar2 = indent;
    if (indent != 0) {
      do {
        printf("    ");
        uVar2 = uVar2 - 1;
      } while (uVar2 != 0);
    }
    puts("      MEMBERS:");
    if (info->member_count != 0) {
      uVar2 = indent + 1;
      uVar3 = 0;
      do {
        pMVar1 = info->members;
        uVar4 = indent;
        uVar5 = uVar2;
        if (indent == 0) {
          puts("      MEMBERS:");
LAB_0010892a:
          do {
            printf("    ");
            uVar5 = uVar5 - 1;
            uVar4 = uVar2;
          } while (uVar5 != 0);
        }
        else {
          do {
            printf("    ");
            uVar4 = uVar4 - 1;
          } while (uVar4 != 0);
          puts("      MEMBERS:");
          if (uVar2 != 0) goto LAB_0010892a;
          uVar4 = 0;
        }
        printf("      * %d: \"%s\"\n",uVar3 & 0xffffffff,pMVar1[uVar3].name);
        print_typeinfo(&pMVar1[uVar3].info,uVar4);
        uVar3 = uVar3 + 1;
      } while (uVar3 < info->member_count);
    }
  }
  return;
}

Assistant:

static void print_typeinfo(const MOJOSHADER_symbolTypeInfo *info,
                           unsigned int indent)
{
    static const char *symclasses[] = {
        "scalar", "vector", "row-major matrix",
        "column-major matrix", "object", "struct"
    };

    static const char *symtypes[] = {
        "void", "bool", "int", "float", "string", "texture",
        "texture1d", "texture2d", "texture3d", "texturecube",
        "sampler", "sampler1d", "sampler2d", "sampler3d",
        "samplercube", "pixelshader", "vertexshader", "unsupported"
    };

    INDENT();
    printf("      symbol class %s\n", symclasses[info->parameter_class]);
    INDENT();
    printf("      symbol type %s\n", symtypes[info->parameter_type]);
    INDENT();
    printf("      rows %u\n", info->rows);
    INDENT();
    printf("      columns %u\n", info->columns);
    INDENT();
    printf("      elements %u\n", info->elements);

    if (info->member_count > 0)
    {
        int i;
        INDENT(); printf("      MEMBERS:\n");
        for (i = 0; i < info->member_count; i++)
        {
            const MOJOSHADER_symbolStructMember *member = &info->members[i];
            INDENT(); printf("      MEMBERS:\n");
            indent++;
            INDENT(); printf("      * %d: \"%s\"\n", i, member->name);
            print_typeinfo(&member->info, indent);
            indent--;
        } // for
    } // if
}